

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_reporter.c
# Opt level: O1

TestReporter * create_text_reporter(void)

{
  TextMemo *memo;
  TestReporter *reporter;
  undefined8 *puVar1;
  
  reporter = create_reporter();
  if (reporter != (TestReporter *)0x0) {
    puVar1 = (undefined8 *)malloc(0x18);
    if (puVar1 != (undefined8 *)0x0) {
      reporter->memo = puVar1;
      reporter->start_suite = text_reporter_start_suite;
      reporter->start_test = text_reporter_start_test;
      reporter->show_fail = show_fail;
      reporter->show_incomplete = show_incomplete;
      reporter->finish_test = text_reporter_finish;
      reporter->finish_suite = text_reporter_finish_suite;
      *puVar1 = printf;
      puVar1[1] = vprintf;
      return reporter;
    }
    destroy_reporter(reporter);
  }
  return (TestReporter *)0x0;
}

Assistant:

TestReporter *create_text_reporter(void) {
    TextMemo *memo;
    TestReporter *reporter = create_reporter();

    if (reporter == NULL) {
        return NULL;
    }

    memo = (TextMemo *)malloc(sizeof(TextMemo));
    if (memo == NULL) {
        destroy_reporter(reporter);
        return NULL;
    }
    reporter->memo = memo;

    reporter->start_suite = &text_reporter_start_suite;
    reporter->start_test = &text_reporter_start_test;
    reporter->show_fail = &show_fail;
    reporter->show_incomplete = &show_incomplete;
    reporter->finish_test = &text_reporter_finish;
    reporter->finish_suite = &text_reporter_finish_suite;

    set_text_reporter_printer(reporter, printf);
    set_text_reporter_vprinter(reporter, vprintf);

    return reporter;
}